

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

void RigidBodyDynamics::CalcConstrainedSystemVariables
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS,
               bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  long *plVar1;
  Constraint *this;
  bool bVar2;
  long lVar3;
  ActualDstType actualDst_1;
  undefined7 in_register_00000089;
  ulong uVar4;
  ActualDstType actualDst;
  ulong uVar5;
  
  if ((int)CONCAT71(in_register_00000089,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  NonlinearEffects(model,Q,QDot,(VectorNd *)(CS + 0x178),f_ext);
  if (0 < *(long *)(CS + 0x170) * *(long *)(CS + 0x168)) {
    memset(*(void **)(CS + 0x160),0,*(long *)(CS + 0x170) * *(long *)(CS + 0x168) * 8);
  }
  CompositeRigidBodyAlgorithm(model,Q,(MatrixNd *)(CS + 0x160),false);
  CalcConstraintsJacobian(model,Q,CS,(MatrixNd *)(CS + 0x198),false);
  CalcConstraintsPositionError(model,Q,CS,(VectorNd *)(CS + 0x110),false);
  CalcConstraintsVelocityError(model,Q,QDot,CS,(VectorNd *)(CS + 0x120),false);
  if (0 < *(long *)(CS + 0x530)) {
    memset(*(void **)(CS + 0x528),0,*(long *)(CS + 0x530) << 3);
  }
  UpdateKinematicsCustom(model,(VectorNd *)0x0,(VectorNd *)0x0,(VectorNd *)(CS + 0x528));
  lVar3 = *(long *)(CS + 200);
  if (*(long *)(CS + 0xd0) != lVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      plVar1 = *(long **)(lVar3 + uVar4 * 0x10);
      (**(code **)(*plVar1 + 0x10))(0,plVar1,model,Q,QDot,CS + 0x198,CS + 0x188,CS + 0x620,0);
      lVar3 = *(long *)(CS + 200);
      this = *(Constraint **)(lVar3 + uVar4 * 0x10);
      if (this->baumgarteEnabled == true) {
        Constraint::addInBaumgarteStabilizationForces
                  (this,(VectorNd *)(CS + 0x110),(VectorNd *)(CS + 0x120),(VectorNd *)(CS + 0x188));
        lVar3 = *(long *)(CS + 200);
      }
      bVar2 = uVar5 < (ulong)(*(long *)(CS + 0xd0) - lVar3 >> 4);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcConstrainedSystemVariables (
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &Tau,
  ConstraintSet &CS,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext
)
{
  // Compute G
  if(update_kinematics){
    UpdateKinematicsCustom(model, &Q, NULL, NULL);
  }

  // Compute C
  NonlinearEffects(model, Q, QDot, CS.C, f_ext);
  assert(CS.H.cols() == model.dof_count && CS.H.rows() == model.dof_count);

  // Compute H
  CS.H.setZero();
  CompositeRigidBodyAlgorithm(model, Q, CS.H, false);

  CalcConstraintsJacobian (model, Q, CS, CS.G, false);

  // Compute position error for Baumgarte Stabilization.
  CalcConstraintsPositionError (model, Q, CS, CS.err, false);

  // Compute velocity error for Baugarte stabilization.
  CalcConstraintsVelocityError (model, Q, QDot, CS, CS.errd, false);
  //CS.errd = CS.G * QDot;

  // Compute gamma
  unsigned int prev_body_id = 0;
  Vector3d prev_body_point = Vector3d::Zero();
  Vector3d gamma_i = Vector3d::Zero();

  CS.QDDot_0.setZero();
  UpdateKinematicsCustom(model, NULL, NULL, &CS.QDDot_0);


  for(unsigned int i=0; i<CS.constraints.size(); ++i) {
    CS.constraints[i]->calcGamma(model,0,Q,QDot,CS.G,CS.gamma,CS.cache);
    if(CS.constraints[i]->isBaumgarteStabilizationEnabled()) {
      CS.constraints[i]->addInBaumgarteStabilizationForces(
        CS.err,CS.errd,CS.gamma);
    }
  }


}